

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O3

void __thiscall fmp4_stream::media_fragment::print(media_fragment *this)

{
  pointer peVar1;
  ulong uVar2;
  pointer peVar3;
  ulong uVar4;
  long lVar5;
  
  peVar3 = (this->emsg_).super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
           _M_impl.super__Vector_impl_data._M_start;
  peVar1 = (this->emsg_).super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (peVar1 != peVar3) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      if ((*(long *)((long)&((string *)(&peVar3->super_full_box + 1))->_M_string_length + lVar5) !=
           0) && (this->e_msg_is_in_mdat_ == false)) {
        (**(code **)(*(long *)((peVar3->super_full_box).super_box.extended_type_ + lVar5 + -0x38) +
                    8))();
        peVar3 = (this->emsg_).
                 super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl.
                 super__Vector_impl_data._M_start;
        peVar1 = (this->emsg_).
                 super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar4 = uVar4 + 1;
      uVar2 = ((long)peVar1 - (long)peVar3 >> 5) * 0x6db6db6db6db6db7;
      lVar5 = lVar5 + 0xe0;
    } while (uVar4 <= uVar2 && uVar2 - uVar4 != 0);
  }
  box::print(&this->moof_box_);
  mfhd::print(&this->mfhd_);
  tfhd::print(&this->tfhd_);
  tfdt::print(&this->tfdt_);
  trun::print(&this->trun_);
  box::print(&this->mdat_box_);
  peVar3 = (this->emsg_).super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
           _M_impl.super__Vector_impl_data._M_start;
  peVar1 = (this->emsg_).super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (peVar1 != peVar3) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      if ((*(long *)((long)&((string *)(&peVar3->super_full_box + 1))->_M_string_length + lVar5) !=
           0) && (this->e_msg_is_in_mdat_ == true)) {
        (**(code **)(*(long *)((peVar3->super_full_box).super_box.extended_type_ + lVar5 + -0x38) +
                    8))();
        peVar3 = (this->emsg_).
                 super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl.
                 super__Vector_impl_data._M_start;
        peVar1 = (this->emsg_).
                 super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar4 = uVar4 + 1;
      uVar2 = ((long)peVar1 - (long)peVar3 >> 5) * 0x6db6db6db6db6db7;
      lVar5 = lVar5 + 0xe0;
    } while (uVar4 <= uVar2 && uVar2 - uVar4 != 0);
  }
  return;
}

Assistant:

void media_fragment::print() const
	{
		for(int i=0;i<emsg_.size();i++)
		    if (emsg_[i].scheme_id_uri_.size() && !this->e_msg_is_in_mdat_)
			   emsg_[i].print();

		moof_box_.print(); // moof box size
		mfhd_.print(); // moof box header
		tfhd_.print(); // track fragment header
		tfdt_.print(); // track fragment decode time
		trun_.print(); // trun box
		mdat_box_.print(); // mdat 

		for (int i = 0; i<emsg_.size(); i++)
		    if (emsg_[i].scheme_id_uri_.size() && this->e_msg_is_in_mdat_)
			    emsg_[i].print();
	}